

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O0

void sycc_to_rgb(int offset,int upb,int y,int cb,int cr,int *out_r,int *out_g,int *out_b)

{
  undefined4 local_34;
  undefined4 local_30;
  int b;
  int g;
  int r;
  int *out_r_local;
  int cr_local;
  int cb_local;
  int y_local;
  int upb_local;
  int offset_local;
  
  b = y + (int)((float)(cr - offset) * 1.402);
  if (b < 0) {
    b = 0;
  }
  else if (upb < b) {
    b = upb;
  }
  *out_r = b;
  local_30 = y - (int)((float)(cb - offset) * 0.344 + (float)(cr - offset) * 0.714);
  if (local_30 < 0) {
    local_30 = 0;
  }
  else if (upb < local_30) {
    local_30 = upb;
  }
  *out_g = local_30;
  local_34 = y + (int)((float)(cb - offset) * 1.772);
  if (local_34 < 0) {
    local_34 = 0;
  }
  else if (upb < local_34) {
    local_34 = upb;
  }
  *out_b = local_34;
  return;
}

Assistant:

static void sycc_to_rgb(int offset, int upb, int y, int cb, int cr,
                        int *out_r, int *out_g, int *out_b)
{
    int r, g, b;

    cb -= offset;
    cr -= offset;
    r = y + (int)(1.402 * (float)cr);
    if (r < 0) {
        r = 0;
    } else if (r > upb) {
        r = upb;
    }
    *out_r = r;

    g = y - (int)(0.344 * (float)cb + 0.714 * (float)cr);
    if (g < 0) {
        g = 0;
    } else if (g > upb) {
        g = upb;
    }
    *out_g = g;

    b = y + (int)(1.772 * (float)cb);
    if (b < 0) {
        b = 0;
    } else if (b > upb) {
        b = upb;
    }
    *out_b = b;
}